

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip.c++
# Opt level: O2

void __thiscall
kj::GzipAsyncInputStream::GzipAsyncInputStream(GzipAsyncInputStream *this,AsyncInputStream *inner)

{
  Fault f;
  DebugComparison<int,_int> _kjCondition;
  
  (this->super_AsyncInputStream)._vptr_AsyncInputStream = (_func_int **)&PTR_read_0059fc20;
  this->inner = inner;
  (this->ctx).next_in = (Bytef *)0x0;
  (this->ctx).avail_in = 0;
  (this->ctx).total_in = 0;
  (this->ctx).next_out = (Bytef *)0x0;
  (this->ctx).avail_out = 0;
  (this->ctx).total_out = 0;
  (this->ctx).msg = (char *)0x0;
  (this->ctx).data_type = 0;
  (this->ctx).state = (internal_state *)0x0;
  (this->ctx).zalloc = (alloc_func)0x0;
  (this->ctx).zfree = (free_func)0x0;
  (this->ctx).opaque = (voidpf)0x0;
  (this->ctx).adler = 0;
  (this->ctx).reserved = 0;
  this->atValidEndpoint = false;
  _kjCondition.left = inflateInit2_(&this->ctx,0x1f,"1.2.11",0x70);
  _kjCondition.right = 0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == 0;
  if (_kjCondition.result) {
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<int,int>&>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/gzip.c++"
             ,0xb9,FAILED,"inflateInit2(&ctx, 15 + 16) == Z_OK","_kjCondition,",&_kjCondition);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

GzipAsyncInputStream::GzipAsyncInputStream(AsyncInputStream& inner)
    : inner(inner) {
  // windowBits = 15 (maximum) + magic value 16 to ask for gzip.
  KJ_ASSERT(inflateInit2(&ctx, 15 + 16) == Z_OK);
}